

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ADC_ID_Y(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  
  this->cycles = 5;
  bVar6 = this->A;
  bVar1 = GetByte(this);
  uVar3 = ReadWord(this,(ushort)bVar1);
  bVar1 = ReadByte(this,this->Y + uVar3);
  uVar4 = ((this->field_6).ps & 1) + (uint)this->A + (uint)bVar1;
  bVar2 = (byte)uVar4;
  this->A = bVar2;
  uVar5 = bVar6 & 0xffffff80;
  bVar6 = ((bVar2 & 0x80) != (byte)uVar5) << 6;
  if ((bVar1 & 0xffffff80) != uVar5) {
    bVar6 = 0;
  }
  (this->field_6).ps =
       (bVar2 == 0) * '\x02' | (this->field_6).ps & 0x3c | 0xff < uVar4 | bVar6 | bVar2 & 0x80;
  return;
}

Assistant:

void CPU::ADC_ID_Y()
{
    cycles = 5;
    uint8_t acp = A, op = ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}